

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

void __thiscall CholeskyFactor::resize(CholeskyFactor *this,HighsInt new_k_max)

{
  uint uVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> L_old;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  uVar3 = (ulong)(uint)new_k_max;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,&this->L);
  pdVar2 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&this->L,(ulong)(uint)(new_k_max * new_k_max));
  pdVar2 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = this->current_k_max;
  if ((int)uVar1 < new_k_max) {
    uVar3 = (ulong)uVar1;
  }
  lVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      pdVar2[uVar7] =
           *(double *)((long)local_30._M_impl.super__Vector_impl_data._M_start + uVar7 * 8 + lVar4);
    }
    pdVar2 = pdVar2 + new_k_max;
    lVar4 = lVar4 + (long)(int)uVar1 * 8;
  }
  this->current_k_max = new_k_max;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void resize(HighsInt new_k_max) {
    std::vector<double> L_old = L;
    L.clear();
    L.resize((new_k_max) * (new_k_max));
    const HighsInt l_size = L.size();
    // Driven by #958, changes made in following lines to avoid array
    // bound error when new_k_max < current_k_max
    HighsInt min_k_max = min(new_k_max, current_k_max);
    for (HighsInt i = 0; i < min_k_max; i++) {
      for (HighsInt j = 0; j < min_k_max; j++) {
        assert(i * (new_k_max) + j < l_size);
        L[i * (new_k_max) + j] = L_old[i * current_k_max + j];
      }
    }
    current_k_max = new_k_max;
  }